

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractValues.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  exception *e;
  undefined1 local_58 [8];
  CommandLine cmdLine;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  cmdLine._56_8_ = argv;
  CommandLine::CommandLine((CommandLine *)local_58);
  bVar1 = parseCommandLine((CommandLine *)local_58,argc,(char **)cmdLine._56_8_);
  if (bVar1) {
    printTaggedValues((CommandLine *)local_58,(ostream *)&std::cout);
  }
  else {
    printHelp(*(char **)cmdLine._56_8_);
    argv_local._4_4_ = -1;
  }
  CommandLine::~CommandLine((CommandLine *)local_58);
  if (bVar1) {
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, const char* const* argv)
{
	try
	{
		CommandLine cmdLine;

		if (!parseCommandLine(cmdLine, argc, argv))
		{
			printHelp(argv[0]);
			return -1;
		}

		printTaggedValues(cmdLine, std::cout);
	}
	catch (const std::exception& e)
	{
		printf("FATAL ERROR: %s\n", e.what());
		return -1;
	}

	return 0;
}